

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

void __thiscall Quat4f::setAxisAngle(Quat4f *this,float radians,Vector3f *axis)

{
  Vector3f *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  float reciprocalVectorNorm;
  float vectorNorm;
  float sinHalfTheta;
  
  dVar4 = cos((double)(in_XMM0_Da / 2.0));
  *in_RDI = (float)dVar4;
  dVar4 = sin((double)(in_XMM0_Da / 2.0));
  fVar1 = (float)dVar4;
  fVar2 = Vector3f::length((Vector3f *)0x37017d);
  fVar2 = 1.0 / fVar2;
  fVar3 = Vector3f::x(in_RSI);
  in_RDI[1] = fVar3 * fVar1 * fVar2;
  fVar3 = Vector3f::y(in_RSI);
  in_RDI[2] = fVar3 * fVar1 * fVar2;
  fVar3 = Vector3f::z(in_RSI);
  in_RDI[3] = fVar3 * fVar1 * fVar2;
  return;
}

Assistant:

void Quat4f::setAxisAngle( float radians, const Vector3f& axis )
{
	m_elements[ 0 ] = cos( radians / 2 );

	float sinHalfTheta = sin( radians / 2 );
	float vectorNorm = axis.length();
	float reciprocalVectorNorm = 1.f / vectorNorm;

	m_elements[ 1 ] = axis.x() * sinHalfTheta * reciprocalVectorNorm;
	m_elements[ 2 ] = axis.y() * sinHalfTheta * reciprocalVectorNorm;
	m_elements[ 3 ] = axis.z() * sinHalfTheta * reciprocalVectorNorm;
}